

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

Arg * __thiscall
fmt::BasicFormatter<char,_fmt::ArgFormatter<char>_>::parse_arg_index
          (BasicFormatter<char,_fmt::ArgFormatter<char>_> *this,Char **s)

{
  CStringRef message;
  undefined8 *in_RDX;
  undefined8 in_RSI;
  uint arg_index;
  Arg *in_RDI;
  char *error;
  FormatError *this_00;
  FormatterBase *in_stack_ffffffffffffffd0;
  BasicCStringRef<char> local_20;
  FormatError *local_18;
  undefined8 *local_10;
  
  arg_index = (uint)((ulong)in_RSI >> 0x20);
  local_18 = (FormatError *)0x0;
  local_10 = in_RDX;
  if ((*(char *)*in_RDX < '0') || ('9' < *(char *)*in_RDX)) {
    internal::FormatterBase::next_arg((FormatterBase *)in_RDI,(char **)in_RDI);
  }
  else {
    internal::parse_nonnegative_int<char>((char **)in_stack_ffffffffffffffd0);
    internal::FormatterBase::get_arg(in_stack_ffffffffffffffd0,arg_index,(char **)in_RDI);
  }
  if (local_18 == (FormatError *)0x0) {
    return in_RDI;
  }
  message.data_ = (char *)__cxa_allocate_exception(0x10);
  this_00 = local_18;
  if ((*(char *)*local_10 != '}') && (*(char *)*local_10 != ':')) {
    this_00 = (FormatError *)"invalid format string";
  }
  BasicCStringRef<char>::BasicCStringRef(&local_20,(char *)this_00);
  FormatError::FormatError(this_00,message);
  __cxa_throw(message.data_,&FormatError::typeinfo,FormatError::~FormatError);
}

Assistant:

inline internal::Arg BasicFormatter<Char, AF>::parse_arg_index(const Char *&s) {
  const char *error = 0;
  internal::Arg arg = *s < '0' || *s > '9' ?
        next_arg(error) : get_arg(internal::parse_nonnegative_int(s), error);
  if (error) {
    FMT_THROW(FormatError(
                *s != '}' && *s != ':' ? "invalid format string" : error));
  }
  return arg;
}